

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O3

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer puVar3;
  cmGeneratorExpressionEvaluator *pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  size_type *psVar10;
  pointer puVar11;
  string *psVar12;
  uint uVar13;
  const_iterator pit;
  string parameter;
  string local_218;
  cmGeneratorExpressionContext *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  GeneratorExpressionContent *local_1d0;
  string *local_1c8;
  string *local_1c0;
  cmGeneratorExpressionNode *local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = context;
  local_1c8 = identifier;
  local_1c0 = __return_storage_ptr__;
  uVar5 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
  pit._M_current =
       (this->ParamChildren).
       super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->ParamChildren).
           super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = this;
  local_1b8 = node;
  iVar6 = (*node->_vptr_cmGeneratorExpressionNode[4])(node);
  local_1b0 = pvVar2;
  if (pit._M_current != pvVar2) {
    uVar13 = 1;
    do {
      if ((uVar13 == uVar5 & (byte)iVar6) == 1) {
        ProcessArbitraryContent
                  ((string *)local_1a8,local_1d0,local_1b8,local_1c8,local_1f8,dagChecker,pit);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
                   (string *)local_1a8);
        psVar12 = local_1c0;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_005c6884;
        goto LAB_005c6894;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      iVar7 = (*local_1b8->_vptr_cmGeneratorExpressionNode[6])(local_1b8,parameters,local_1a8);
      if ((char)iVar7 != '\0') {
        puVar3 = ((pit._M_current)->
                 super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (puVar11 = ((pit._M_current)->
                       super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar3;
            puVar11 = puVar11 + 1) {
          pcVar4 = (puVar11->_M_t).
                   super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                   .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl;
          (*pcVar4->_vptr_cmGeneratorExpressionEvaluator[3])(&local_218,pcVar4,local_1f8,dagChecker)
          ;
          std::__cxx11::string::_M_append(local_1a8,(ulong)local_218._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          psVar12 = local_1c0;
          if (local_1f8->HadError != false) {
            (local_1c0->_M_dataplus)._M_p = (pointer)&local_1c0->field_2;
            local_1c0->_M_string_length = 0;
            (local_1c0->field_2)._M_local_buf[0] = '\0';
            if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
              return local_1c0;
            }
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
            return psVar12;
          }
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      pit._M_current = pit._M_current + 1;
      uVar13 = uVar13 + 1;
    } while (pit._M_current != local_1b0);
  }
  psVar12 = local_1c0;
  if (((int)uVar5 < 1) ||
     ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)uVar5)) {
    if (uVar5 == 0xfffffffc) {
      if ((ulong)((long)(parameters->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_005c6894;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d0->StartContent,
                 local_1d0->StartContent + local_1d0->ContentLength);
      std::operator+(&local_1f0,"$<",local_1c8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218.field_2._8_8_ = plVar8[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_218._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      reportError(local_1f8,(string *)local_1a8,&local_218);
    }
    else if (uVar5 == 0xfffffffe) {
      if (0x20 < (ulong)((long)(parameters->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(parameters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)) goto LAB_005c6894;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d0->StartContent,
                 local_1d0->StartContent + local_1d0->ContentLength);
      std::operator+(&local_1f0,"$<",local_1c8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218.field_2._8_8_ = plVar8[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_218._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      reportError(local_1f8,(string *)local_1a8,&local_218);
    }
    else {
      if ((uVar5 != 0xffffffff) ||
         ((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) goto LAB_005c6894;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d0->StartContent,
                 local_1d0->StartContent + local_1d0->ContentLength);
      std::operator+(&local_1f0,"$<",local_1c8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218.field_2._8_8_ = plVar8[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_218._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      reportError(local_1f8,(string *)local_1a8,&local_218);
    }
  }
  else {
    if (uVar5 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator+(&local_1f0,"$<",local_1c8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      psVar12 = local_1c0;
      paVar1 = &local_218.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218.field_2._8_8_ = plVar8[3];
        local_218._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_218._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length
                         );
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," comma separated parameters, but got ",0x25);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," instead.",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_218._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,local_1d0->StartContent,
                 local_1d0->StartContent + local_1d0->ContentLength);
      std::__cxx11::stringbuf::str();
      reportError(local_1f8,&local_218,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_005c6894;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,local_1d0->StartContent,
               local_1d0->StartContent + local_1d0->ContentLength);
    std::operator+(&local_1f0,"$<",local_1c8);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    psVar12 = local_1c0;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_218.field_2._M_allocated_capacity = *psVar10;
      local_218.field_2._8_8_ = plVar8[3];
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar10;
      local_218._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_218._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    reportError(local_1f8,(string *)local_1a8,&local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_005c6884:
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
LAB_005c6894:
  (psVar12->_M_dataplus)._M_p = (pointer)&psVar12->field_2;
  psVar12->_M_string_length = 0;
  (psVar12->field_2)._M_local_buf[0] = '\0';
  return psVar12;
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    auto pit = this->ParamChildren.begin();
    const auto pend = this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        parameters.push_back(this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit));
        return std::string();
      }
      std::string parameter;
      if (node->ShouldEvaluateNextParameter(parameters, parameter)) {
        for (const auto& pExprEval : *pit) {
          parameter += pExprEval->Evaluate(context, dagChecker);
          if (context->HadError) {
            return std::string();
          }
        }
      }
      parameters.push_back(std::move(parameter));
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       static_cast<unsigned int>(numExpected) != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least one parameter.");
  } else if (numExpected == cmGeneratorExpressionNode::TwoOrMoreParameters &&
             parameters.size() < 2) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least two parameters.");
  } else if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
             parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}